

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadContents(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Logger *pLVar5;
  undefined4 extraout_var_00;
  FormatVersion FVar6;
  char *message;
  char *local_1c8 [4];
  ostream local_1a8 [376];
  undefined4 extraout_var;
  
  do {
    while( true ) {
      do {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 1);
      bVar1 = IsElement(this,"COLLADA");
      if (bVar1) break;
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[26]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [26])"Ignoring global element <");
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      std::operator<<(local_1a8,(char *)CONCAT44(extraout_var_00,iVar2));
      std::operator<<(local_1a8,">.");
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar5,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      SkipElement(this);
    }
    uVar3 = TestAttribute(this,"version");
    if (uVar3 != 0xffffffff) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
      if (*pcVar4 == '1') {
        if (pcVar4[1] == '.') {
          FVar6 = FV_1_5_n;
          message = "Collada schema version is 1.5.n";
          if (pcVar4[2] != '5') goto LAB_0038ee38;
LAB_0038ee64:
          this->mFormat = FVar6;
          pLVar5 = DefaultLogger::get();
          Logger::debug(pLVar5,message);
        }
        else {
LAB_0038ee38:
          if (pcVar4[1] == '.') {
            FVar6 = FV_1_4_n;
            message = "Collada schema version is 1.4.n";
            if (pcVar4[2] == '4') goto LAB_0038ee64;
          }
          if (pcVar4[1] == '.') {
            FVar6 = FV_1_3_n;
            message = "Collada schema version is 1.3.n";
            if (pcVar4[2] == '3') goto LAB_0038ee64;
          }
        }
      }
    }
    ReadStructure(this);
  } while( true );
}

Assistant:

void ColladaParser::ReadContents()
{
    while (mReader->read())
    {
        // handle the root element "COLLADA"
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("COLLADA"))
            {
                // check for 'version' attribute
                const int attrib = TestAttribute("version");
                if (attrib != -1) {
                    const char* version = mReader->getAttributeValue(attrib);

                    if (!::strncmp(version, "1.5", 3)) {
                        mFormat = FV_1_5_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.5.n");
                    }
                    else if (!::strncmp(version, "1.4", 3)) {
                        mFormat = FV_1_4_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.4.n");
                    }
                    else if (!::strncmp(version, "1.3", 3)) {
                        mFormat = FV_1_3_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.3.n");
                    }
                }

                ReadStructure();
            }
            else
            {
                ASSIMP_LOG_DEBUG_F("Ignoring global element <", mReader->getNodeName(), ">.");
                SkipElement();
            }
        }
        else
        {
            // skip everything else silently
        }
    }
}